

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void ARM_printInst(MCInst *MI,SStream *O,void *Info)

{
  byte bVar1;
  cs_detail *pcVar2;
  cs_struct *pcVar3;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  MCRegisterClass *pMVar8;
  int64_t iVar9;
  MCOperand *pMVar10;
  MCOperand *pMVar11;
  MCOperand *op;
  MCOperand *pMVar12;
  uint64_t uVar13;
  uint8_t *puVar14;
  char *pcVar15;
  ulong uVar16;
  uint8_t uVar17;
  uint32_t val;
  bool bVar18;
  MCInst NewMI;
  MCInst local_390;
  
  uVar5 = MCInst_getOpcode(MI);
  if ((int)uVar5 < 0x1c1) {
    if ((int)uVar5 < 0xe6) {
      if ((int)uVar5 < 0x98) {
        if (uVar5 == 0x72) goto LAB_001eedd1;
        if (uVar5 != 0x7f) goto LAB_001ef207;
      }
      else {
        if (uVar5 == 0x98) {
LAB_001eee92:
          pMVar12 = MCInst_getOperand(MI,0);
          uVar6 = MCOperand_getReg(pMVar12);
          if ((uVar6 != 0xc) || (uVar6 = MCInst_getNumOperands(MI), uVar6 < 6)) goto LAB_001ef207;
          SStream_concat0(O,"pop");
          MCInst_setOpcodePub(MI,0x1a7);
          printPredicateOperand(MI,2,O);
          if (uVar5 == 0x949) {
            SStream_concat0(O,".w");
          }
          SStream_concat0(O,anon_var_dwarf_37336c + 0x11);
          MI->ac_idx = '\x01';
          goto LAB_001eef97;
        }
        if (uVar5 != 0xa9) {
          if (uVar5 == 0xc0) {
            pMVar12 = MCInst_getOperand(MI,2);
            uVar5 = MCOperand_getReg(pMVar12);
            if (uVar5 == 0xc) {
              pMVar12 = MCInst_getOperand(MI,4);
              iVar9 = MCOperand_getImm(pMVar12);
              if (((((uint)iVar9 >> 0xc & 1) == 0) &&
                  (iVar9 = MCOperand_getImm(pMVar12), ((uint)iVar9 & 0xfff) == 4)) ||
                 (iVar9 = MCOperand_getImm(pMVar12), iVar9 == 4)) {
                SStream_concat0(O,"pop");
                MCInst_setOpcodePub(MI,0x1a7);
                printPredicateOperand(MI,5,O);
                SStream_concat0(O,"\t{");
                pcVar3 = MI->csh;
                pMVar12 = MCInst_getOperand(MI,0);
                uVar5 = MCOperand_getReg(pMVar12);
                pcVar15 = (*pcVar3->get_regname)(uVar5);
                SStream_concat0(O,pcVar15);
                if (MI->csh->detail != CS_OPT_OFF) {
                  pcVar2 = MI->flat_insn->detail;
                  puVar14 = pcVar2->groups +
                            (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
                  puVar14[0] = '\x01';
                  puVar14[1] = '\0';
                  puVar14[2] = '\0';
                  puVar14[3] = '\0';
                  pMVar12 = MCInst_getOperand(MI,0);
                  uVar5 = MCOperand_getReg(pMVar12);
                  pcVar2 = MI->flat_insn->detail;
                  *(uint *)(pcVar2->groups +
                           (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45) = uVar5;
                  pcVar2 = MI->flat_insn->detail;
                  pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] =
                       '\x02';
                  puVar14 = &(MI->flat_insn->detail->field_6).arm.op_count;
                  *puVar14 = *puVar14 + '\x01';
                  pcVar2 = MI->flat_insn->detail;
                  bVar1 = pcVar2->regs_read_count;
                  pcVar2->regs_read[bVar1] = 0xc;
                  pcVar2->regs_read_count = bVar1 + 1;
                  bVar1 = pcVar2->regs_write_count;
                  pcVar2->regs_write[bVar1] = 0xc;
                  pcVar2->regs_write_count = bVar1 + 1;
                }
                goto LAB_001ef1e7;
              }
            }
          }
          goto LAB_001ef207;
        }
      }
    }
    else {
      if ((int)uVar5 < 0x199) {
        if (uVar5 == 0xe6) {
          pMVar12 = MCInst_getOperand(MI,0);
          pMVar10 = MCInst_getOperand(MI,1);
          pMVar11 = MCInst_getOperand(MI,2);
          iVar9 = MCOperand_getImm(pMVar11);
          uVar6 = (uint)iVar9 & 7;
          uVar5 = uVar6 - 1;
          if (uVar5 < 5) {
            pcVar15 = *(char **)(&DAT_006531a0 + (ulong)uVar5 * 8);
          }
          else {
            pcVar15 = anon_var_dwarf_407d6e + 0x11;
          }
          SStream_concat0(O,pcVar15);
          if (uVar5 < 5) {
            MCInst_setOpcodePub(MI,*(uint *)(&DAT_0037cf50 + (ulong)uVar5 * 4));
          }
          printSBitModifierOperand(MI,5,O);
          printPredicateOperand(MI,3,O);
          SStream_concat0(O,anon_var_dwarf_37336c + 0x11);
          pcVar3 = MI->csh;
          uVar5 = MCOperand_getReg(pMVar12);
          pcVar15 = (*pcVar3->get_regname)(uVar5);
          SStream_concat0(O,pcVar15);
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar2 = MI->flat_insn->detail;
            puVar14 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
            puVar14[0] = '\x01';
            puVar14[1] = '\0';
            puVar14[2] = '\0';
            puVar14[3] = '\0';
            uVar5 = MCOperand_getReg(pMVar12);
            pcVar2 = MI->flat_insn->detail;
            *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45)
                 = uVar5;
            pcVar2 = MI->flat_insn->detail;
            pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = '\x02';
            puVar14 = &(MI->flat_insn->detail->field_6).arm.op_count;
            *puVar14 = *puVar14 + '\x01';
          }
          SStream_concat0(O,", ");
          pcVar3 = MI->csh;
          uVar5 = MCOperand_getReg(pMVar10);
          pcVar15 = (*pcVar3->get_regname)(uVar5);
          SStream_concat0(O,pcVar15);
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar2 = MI->flat_insn->detail;
            puVar14 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
            puVar14[0] = '\x01';
            puVar14[1] = '\0';
            puVar14[2] = '\0';
            puVar14[3] = '\0';
            uVar5 = MCOperand_getReg(pMVar10);
            pcVar2 = MI->flat_insn->detail;
            *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45)
                 = uVar5;
            pcVar2 = MI->flat_insn->detail;
            pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = '\x01';
            puVar14 = &(MI->flat_insn->detail->field_6).arm.op_count;
            *puVar14 = *puVar14 + '\x01';
          }
          if (uVar6 == 5) {
            return;
          }
          SStream_concat0(O,", ");
          uVar16 = MCOperand_getImm(pMVar11);
          val = 0x20;
          if (7 < (uint)uVar16) {
            val = (uint)(uVar16 >> 3) & 0x1fffffff;
          }
          printUInt32Bang(O,val);
          if (MI->csh->detail == CS_OPT_OFF) {
            return;
          }
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 9) =
               uVar6;
          pcVar2 = MI->flat_insn->detail;
          *(uint32_t *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0xd)
               = val;
          return;
        }
        if (uVar5 == 0xe7) {
          pMVar12 = MCInst_getOperand(MI,0);
          pMVar10 = MCInst_getOperand(MI,1);
          pMVar11 = MCInst_getOperand(MI,2);
          op = MCInst_getOperand(MI,3);
          iVar9 = MCOperand_getImm(op);
          uVar5 = ((uint)iVar9 & 7) - 1;
          if (uVar5 < 5) {
            pcVar15 = *(char **)(&DAT_006531a0 + (ulong)uVar5 * 8);
          }
          else {
            pcVar15 = anon_var_dwarf_407d6e + 0x11;
          }
          SStream_concat0(O,pcVar15);
          if (uVar5 < 5) {
            MCInst_setOpcodePub(MI,*(uint *)(&DAT_0037cf50 + (ulong)uVar5 * 4));
          }
          printSBitModifierOperand(MI,6,O);
          printPredicateOperand(MI,4,O);
          SStream_concat0(O,anon_var_dwarf_37336c + 0x11);
          pcVar3 = MI->csh;
          uVar5 = MCOperand_getReg(pMVar12);
          pcVar15 = (*pcVar3->get_regname)(uVar5);
          SStream_concat0(O,pcVar15);
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar2 = MI->flat_insn->detail;
            puVar14 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
            puVar14[0] = '\x01';
            puVar14[1] = '\0';
            puVar14[2] = '\0';
            puVar14[3] = '\0';
            uVar5 = MCOperand_getReg(pMVar12);
            pcVar2 = MI->flat_insn->detail;
            *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45)
                 = uVar5;
            pcVar2 = MI->flat_insn->detail;
            pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = '\x02';
            puVar14 = &(MI->flat_insn->detail->field_6).arm.op_count;
            *puVar14 = *puVar14 + '\x01';
          }
          SStream_concat0(O,", ");
          pcVar3 = MI->csh;
          uVar5 = MCOperand_getReg(pMVar10);
          pcVar15 = (*pcVar3->get_regname)(uVar5);
          SStream_concat0(O,pcVar15);
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar2 = MI->flat_insn->detail;
            puVar14 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
            puVar14[0] = '\x01';
            puVar14[1] = '\0';
            puVar14[2] = '\0';
            puVar14[3] = '\0';
            uVar5 = MCOperand_getReg(pMVar10);
            pcVar2 = MI->flat_insn->detail;
            *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45)
                 = uVar5;
            pcVar2 = MI->flat_insn->detail;
            pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = '\x01';
            puVar14 = &(MI->flat_insn->detail->field_6).arm.op_count;
            *puVar14 = *puVar14 + '\x01';
          }
          SStream_concat0(O,", ");
          pcVar3 = MI->csh;
          uVar5 = MCOperand_getReg(pMVar11);
          pcVar15 = (*pcVar3->get_regname)(uVar5);
          SStream_concat0(O,pcVar15);
          if (MI->csh->detail == CS_OPT_OFF) {
            return;
          }
          pcVar2 = MI->flat_insn->detail;
          puVar14 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
          puVar14[0] = '\x01';
          puVar14[1] = '\0';
          puVar14[2] = '\0';
          puVar14[3] = '\0';
          uVar5 = MCOperand_getReg(pMVar11);
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45) =
               uVar5;
          pcVar2 = MI->flat_insn->detail;
          pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = '\x01';
          puVar14 = &(MI->flat_insn->detail->field_6).arm.op_count;
          *puVar14 = *puVar14 + '\x01';
          return;
        }
        goto LAB_001ef207;
      }
      if (uVar5 != 0x199) {
        if (uVar5 == 0x19f) goto LAB_001eef19;
        if (uVar5 != 0x1b4) goto LAB_001ef207;
      }
    }
    pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,1);
    pMVar12 = MCInst_getOperand(MI,(uint)(uVar5 == 0x199 || uVar5 == 0x1b4));
    uVar6 = MCOperand_getReg(pMVar12);
    _Var4 = MCRegisterClass_contains(pMVar8,uVar6);
    if (_Var4) {
      MCInst_Init(&local_390);
      MCInst_setOpcode(&local_390,uVar5);
      if ((uVar5 == 0x1b4) || (uVar7 = 2, uVar5 == 0x199)) {
        pMVar12 = MCInst_getOperand(MI,0);
        MCInst_addOperand2(&local_390,pMVar12);
        uVar7 = 3;
      }
      pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,0x12);
      uVar5 = MCRegisterInfo_getMatchingSuperReg((MCRegisterInfo *)Info,uVar6,9,pMVar8);
      MCOperand_CreateReg0(&local_390,uVar5);
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar7 < uVar5) {
        do {
          pMVar12 = MCInst_getOperand(MI,uVar7);
          MCInst_addOperand2(&local_390,pMVar12);
          uVar7 = uVar7 + 1;
          uVar5 = MCInst_getNumOperands(MI);
        } while (uVar7 < uVar5);
      }
      printInstruction(&local_390,O,(MCRegisterInfo *)Info);
      if (_Var4) {
        return;
      }
    }
    goto LAB_001ef207;
  }
  if ((int)uVar5 < 0x928) {
    if ((int)uVar5 < 0x4eb) {
      if (uVar5 == 0x1c1) {
        pMVar12 = MCInst_getOperand(MI,2);
        uVar5 = MCOperand_getReg(pMVar12);
        if (uVar5 == 0xc) {
          pMVar12 = MCInst_getOperand(MI,3);
          iVar9 = MCOperand_getImm(pMVar12);
          if (iVar9 == -4) {
            SStream_concat0(O,"push");
            MCInst_setOpcodePub(MI,0x1a8);
            printPredicateOperand(MI,4,O);
            SStream_concat0(O,"\t{");
            pcVar3 = MI->csh;
            pMVar12 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar12);
            pcVar15 = (*pcVar3->get_regname)(uVar5);
            SStream_concat0(O,pcVar15);
            if (MI->csh->detail != CS_OPT_OFF) {
              pcVar2 = MI->flat_insn->detail;
              puVar14 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41
              ;
              puVar14[0] = '\x01';
              puVar14[1] = '\0';
              puVar14[2] = '\0';
              puVar14[3] = '\0';
              pMVar12 = MCInst_getOperand(MI,1);
              uVar5 = MCOperand_getReg(pMVar12);
              pcVar2 = MI->flat_insn->detail;
              *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45
                       ) = uVar5;
              pcVar3 = MI->csh;
              uVar5 = MCInst_getOpcode(MI);
              bVar1 = MI->ac_idx;
              puVar14 = ARM_get_op_access(pcVar3,uVar5);
              uVar17 = '\0';
              if (puVar14[bVar1] != 0x80) {
                uVar17 = puVar14[bVar1];
              }
              pcVar2 = MI->flat_insn->detail;
              pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = uVar17;
              MI->ac_idx = MI->ac_idx + '\x01';
              puVar14 = &(MI->flat_insn->detail->field_6).arm.op_count;
              *puVar14 = *puVar14 + '\x01';
            }
LAB_001ef1e7:
            SStream_concat0(O,"}");
            return;
          }
        }
        goto LAB_001ef207;
      }
      if (uVar5 != 0x4e7) goto LAB_001ef207;
LAB_001eec3f:
      pMVar12 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar12);
      if (uVar5 != 0xc) {
LAB_001ef207:
        printInstruction(MI,O,(MCRegisterInfo *)Info);
        return;
      }
      SStream_concat0(O,"vpop");
      uVar5 = 0x1b0;
    }
    else {
      if (uVar5 == 0x4eb) goto LAB_001eec3f;
      if ((uVar5 != 0x883) && (uVar5 != 0x887)) goto LAB_001ef207;
      pMVar12 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar12);
      if (uVar5 != 0xc) goto LAB_001ef207;
      SStream_concat0(O,"vpush");
      uVar5 = 0x1af;
    }
    MCInst_setOpcodePub(MI,uVar5);
    printPredicateOperand(MI,2,O);
    SStream_concat0(O,anon_var_dwarf_37336c + 0x11);
LAB_001eefd1:
    uVar5 = 4;
LAB_001ef38c:
    printRegisterList(MI,uVar5,O);
    return;
  }
  if ((int)uVar5 < 0xa4d) {
    if (uVar5 != 0x928) {
      if (uVar5 == 0x949) goto LAB_001eee92;
      if (uVar5 != 0xa2e) goto LAB_001ef207;
LAB_001eef19:
      pMVar12 = MCInst_getOperand(MI,0);
      uVar6 = MCOperand_getReg(pMVar12);
      if ((uVar6 != 0xc) || (uVar6 = MCInst_getNumOperands(MI), uVar6 < 6)) goto LAB_001ef207;
      SStream_concat0(O,"push");
      MCInst_setOpcodePub(MI,0x1a8);
      printPredicateOperand(MI,2,O);
      if (uVar5 == 0xa2e) {
        SStream_concat0(O,".w");
      }
      SStream_concat0(O,anon_var_dwarf_37336c + 0x11);
LAB_001eef97:
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar2 = MI->flat_insn->detail;
        bVar1 = pcVar2->regs_read_count;
        pcVar2->regs_read[bVar1] = 0xc;
        pcVar2->regs_read_count = bVar1 + 1;
        bVar1 = pcVar2->regs_write_count;
        pcVar2->regs_write[bVar1] = 0xc;
        pcVar2->regs_write_count = bVar1 + 1;
      }
      goto LAB_001eefd1;
    }
  }
  else {
    if (uVar5 == 0xa4d) {
      pMVar12 = MCInst_getOperand(MI,0);
      uVar5 = MCInst_getNumOperands(MI);
      if (((uVar5 == 3) && (_Var4 = MCOperand_isImm(pMVar12), _Var4)) &&
         ((iVar9 = MCOperand_getImm(pMVar12), iVar9 == 0 &&
          (uVar13 = ARM_getFeatureBits(MI->csh->mode), (uVar13 >> 0x20 & 1) != 0)))) {
        SStream_concat0(O,"eret");
        MCInst_setOpcodePub(MI,0x23);
        printPredicateOperand(MI,1,O);
        return;
      }
      goto LAB_001ef207;
    }
    if (uVar5 == 0xab1) {
      pMVar12 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar12);
      uVar6 = MCInst_getNumOperands(MI);
      bVar18 = true;
      if (3 < uVar6) {
        uVar6 = 3;
        bVar18 = true;
        do {
          pMVar12 = MCInst_getOperand(MI,uVar6);
          uVar7 = MCOperand_getReg(pMVar12);
          if (uVar7 == uVar5) {
            bVar18 = false;
          }
          uVar6 = uVar6 + 1;
          uVar7 = MCInst_getNumOperands(MI);
        } while (uVar6 < uVar7);
      }
      SStream_concat0(O,"ldm");
      MCInst_setOpcodePub(MI,0x3b);
      printPredicateOperand(MI,1,O);
      SStream_concat0(O,anon_var_dwarf_37336c + 0x11);
      pcVar15 = (*MI->csh->get_regname)(uVar5);
      SStream_concat0(O,pcVar15);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar2 = MI->flat_insn->detail;
        puVar14 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
        puVar14[0] = '\x01';
        puVar14[1] = '\0';
        puVar14[2] = '\0';
        puVar14[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45) =
             uVar5;
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = '\x03';
        puVar14 = &(MI->flat_insn->detail->field_6).arm.op_count;
        *puVar14 = *puVar14 + '\x01';
      }
      if (bVar18) {
        MI->writeback = true;
        SStream_concat0(O,"!");
      }
      SStream_concat0(O,", ");
      uVar5 = 3;
      goto LAB_001ef38c;
    }
    if (uVar5 != 0xaad) goto LAB_001ef207;
  }
LAB_001eedd1:
  pMVar12 = MCInst_getOperand(MI,0);
  iVar9 = MCOperand_getImm(pMVar12);
  switch(iVar9) {
  case 0:
    uVar6 = 0x1a9;
    pcVar15 = "nop";
    break;
  case 1:
    uVar6 = 0x1aa;
    pcVar15 = "yield";
    break;
  case 2:
    uVar6 = 0x1ab;
    pcVar15 = "wfe";
    break;
  case 3:
    uVar6 = 0x1ac;
    pcVar15 = "wfi";
    break;
  case 4:
    uVar6 = 0x1ad;
    pcVar15 = "sev";
    break;
  case 5:
    uVar13 = ARM_getFeatureBits(MI->csh->mode);
    if ((uVar13 >> 0x29 & 1) == 0) goto switchD_001eedfb_default;
    uVar6 = 0x1ae;
    pcVar15 = "sevl";
    break;
  default:
switchD_001eedfb_default:
    printInstruction(MI,O,(MCRegisterInfo *)Info);
    return;
  }
  SStream_concat0(O,pcVar15);
  printPredicateOperand(MI,1,O);
  if (uVar5 == 0x928) {
    SStream_concat0(O,".w");
  }
  MCInst_setOpcodePub(MI,uVar6);
  return;
}

Assistant:

void ARM_printInst(MCInst *MI, SStream *O, void *Info)
{
	MCRegisterInfo *MRI = (MCRegisterInfo *)Info;
	unsigned Opcode = MCInst_getOpcode(MI), tmp, i, pubOpcode;


	// printf(">>> Opcode 0: %u\n", MCInst_getOpcode(MI));
	switch(Opcode) {
		// Check for HINT instructions w/ canonical names.
		case ARM_HINT:
		case ARM_tHINT:
		case ARM_t2HINT:
			switch (MCOperand_getImm(MCInst_getOperand(MI, 0))) {
				case 0: SStream_concat0(O, "nop"); pubOpcode = ARM_INS_NOP; break;
				case 1: SStream_concat0(O, "yield"); pubOpcode = ARM_INS_YIELD; break;
				case 2: SStream_concat0(O, "wfe"); pubOpcode = ARM_INS_WFE; break;
				case 3: SStream_concat0(O, "wfi"); pubOpcode = ARM_INS_WFI; break;
				case 4: SStream_concat0(O, "sev"); pubOpcode = ARM_INS_SEV; break;
				case 5:
						if ((ARM_getFeatureBits(MI->csh->mode) & ARM_HasV8Ops)) {
							SStream_concat0(O, "sevl");
							pubOpcode = ARM_INS_SEVL;
							break;
						}
						// Fallthrough for non-v8
				default:
						// Anything else should just print normally.
						printInstruction(MI, O, MRI);
						return;
			}
			printPredicateOperand(MI, 1, O);
			if (Opcode == ARM_t2HINT)
				SStream_concat0(O, ".w");

			MCInst_setOpcodePub(MI, pubOpcode);

			return;

			// Check for MOVs and print canonical forms, instead.
		case ARM_MOVsr: {
							// FIXME: Thumb variants?
							unsigned int opc;
							MCOperand *Dst = MCInst_getOperand(MI, 0);
							MCOperand *MO1 = MCInst_getOperand(MI, 1);
							MCOperand *MO2 = MCInst_getOperand(MI, 2);
							MCOperand *MO3 = MCInst_getOperand(MI, 3);

							opc = ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO3));
							SStream_concat0(O, ARM_AM_getShiftOpcStr(opc));
							switch(opc) {
								default:
									break;
								case ARM_AM_asr:
									MCInst_setOpcodePub(MI, ARM_INS_ASR);
									break;
								case ARM_AM_lsl:
									MCInst_setOpcodePub(MI, ARM_INS_LSL);
									break;
								case ARM_AM_lsr:
									MCInst_setOpcodePub(MI, ARM_INS_LSR);
									break;
								case ARM_AM_ror:
									MCInst_setOpcodePub(MI, ARM_INS_ROR);
									break;
								case ARM_AM_rrx:
									MCInst_setOpcodePub(MI, ARM_INS_RRX);
									break;
							}
							printSBitModifierOperand(MI, 6, O);
							printPredicateOperand(MI, 4, O);

							SStream_concat0(O, "\t");
							printRegName(MI->csh, O, MCOperand_getReg(Dst));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(Dst);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_WRITE;
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO1));

							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ;
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO2));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO2);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ;
								MI->flat_insn->detail->arm.op_count++;
							}
							//assert(ARM_AM_getSORegOffset(MO3.getImm()) == 0);
							return;
						}

		case ARM_MOVsi: {
							// FIXME: Thumb variants?
							unsigned int opc;
							MCOperand *Dst = MCInst_getOperand(MI, 0);
							MCOperand *MO1 = MCInst_getOperand(MI, 1);
							MCOperand *MO2 = MCInst_getOperand(MI, 2);

							opc = ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO2));
							SStream_concat0(O, ARM_AM_getShiftOpcStr(opc));
							switch(opc) {
								default:
									break;
								case ARM_AM_asr:
									MCInst_setOpcodePub(MI, ARM_INS_ASR);
									break;
								case ARM_AM_lsl:
									MCInst_setOpcodePub(MI, ARM_INS_LSL);
									break;
								case ARM_AM_lsr:
									MCInst_setOpcodePub(MI, ARM_INS_LSR);
									break;
								case ARM_AM_ror:
									MCInst_setOpcodePub(MI, ARM_INS_ROR);
									break;
								case ARM_AM_rrx:
									MCInst_setOpcodePub(MI, ARM_INS_RRX);
									break;
							}
							printSBitModifierOperand(MI, 5, O);
							printPredicateOperand(MI, 3, O);

							SStream_concat0(O, "\t");
							printRegName(MI->csh, O, MCOperand_getReg(Dst));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(Dst);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_WRITE;
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO1));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ;
								MI->flat_insn->detail->arm.op_count++;
							}

							if (opc == ARM_AM_rrx) {
								//printAnnotation(O, Annot);
								return;
							}

							SStream_concat0(O, ", ");
							tmp = translateShiftImm(getSORegOffset((unsigned int)MCOperand_getImm(MO2)));
							printUInt32Bang(O, tmp);
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type =
									(arm_shifter)opc;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = tmp;
							}
							return;
						}

						// A8.6.123 PUSH
		case ARM_STMDB_UPD:
		case ARM_t2STMDB_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP &&
								MCInst_getNumOperands(MI) > 5) {
							// Should only print PUSH if there are at least two registers in the list.
							SStream_concat0(O, "push");
							MCInst_setOpcodePub(MI, ARM_INS_PUSH);
							printPredicateOperand(MI, 2, O);
							if (Opcode == ARM_t2STMDB_UPD)
								SStream_concat0(O, ".w");
							SStream_concat0(O, "\t");

							if (MI->csh->detail) {
								MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_read_count++;
								MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_write_count++;
							}

							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_STR_PRE_IMM:
						if (MCOperand_getReg(MCInst_getOperand(MI, 2)) == ARM_SP &&
								MCOperand_getImm(MCInst_getOperand(MI, 3)) == -4) {
							SStream_concat0(O, "push");
							MCInst_setOpcodePub(MI, ARM_INS_PUSH);
							printPredicateOperand(MI, 4, O);
							SStream_concat0(O, "\t{");
							printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, 1)));
							if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
								uint8_t access;
#endif
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, 1));
#ifndef CAPSTONE_DIET
								access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = access;
								MI->ac_idx++;
#endif
								MI->flat_insn->detail->arm.op_count++;
							}
							SStream_concat0(O, "}");
							return;
						}
						break;

						// A8.6.122 POP
		case ARM_LDMIA_UPD:
		case ARM_t2LDMIA_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP &&
								MCInst_getNumOperands(MI) > 5) {
							// Should only print POP if there are at least two registers in the list.
							SStream_concat0(O, "pop");
							MCInst_setOpcodePub(MI, ARM_INS_POP);
							printPredicateOperand(MI, 2, O);
							if (Opcode == ARM_t2LDMIA_UPD)
								SStream_concat0(O, ".w");
							SStream_concat0(O, "\t");
							// unlike LDM, POP only write to registers, so skip the 1st access code
							MI->ac_idx = 1;
							if (MI->csh->detail) {
								MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_read_count++;
								MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_write_count++;
							}

							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_LDR_POST_IMM:
						if (MCOperand_getReg(MCInst_getOperand(MI, 2)) == ARM_SP) {
							MCOperand *MO2 = MCInst_getOperand(MI, 4);
							if ((getAM2Op((unsigned int)MCOperand_getImm(MO2)) == ARM_AM_add &&
										getAM2Offset((unsigned int)MCOperand_getImm(MO2)) == 4) ||
									MCOperand_getImm(MO2) == 4) {
								SStream_concat0(O, "pop");
								MCInst_setOpcodePub(MI, ARM_INS_POP);
								printPredicateOperand(MI, 5, O);
								SStream_concat0(O, "\t{");
								printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, 0)));
								if (MI->csh->detail) {
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, 0));
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_WRITE;
									MI->flat_insn->detail->arm.op_count++;
                                    // this instruction implicitly read/write SP register
                                    MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = ARM_REG_SP;
                                    MI->flat_insn->detail->regs_read_count++;
                                    MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = ARM_REG_SP;
                                    MI->flat_insn->detail->regs_write_count++;
								}
								SStream_concat0(O, "}");
								return;
							}
						}
						break;

						// A8.6.355 VPUSH
		case ARM_VSTMSDB_UPD:
		case ARM_VSTMDDB_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP) {
							SStream_concat0(O, "vpush");
							MCInst_setOpcodePub(MI, ARM_INS_VPUSH);
							printPredicateOperand(MI, 2, O);
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

						// A8.6.354 VPOP
		case ARM_VLDMSIA_UPD:
		case ARM_VLDMDIA_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP) {
							SStream_concat0(O, "vpop");
							MCInst_setOpcodePub(MI, ARM_INS_VPOP);
							printPredicateOperand(MI, 2, O);
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_tLDMIA: {
							 bool Writeback = true;
							 unsigned BaseReg = MCOperand_getReg(MCInst_getOperand(MI, 0));
							 unsigned i;
							 for (i = 3; i < MCInst_getNumOperands(MI); ++i) {
								 if (MCOperand_getReg(MCInst_getOperand(MI, i)) == BaseReg)
									 Writeback = false;
							 }

							 SStream_concat0(O, "ldm");
							 MCInst_setOpcodePub(MI, ARM_INS_LDM);

							 printPredicateOperand(MI, 1, O);
							 SStream_concat0(O, "\t");
							 printRegName(MI->csh, O, BaseReg);
							 if (MI->csh->detail) {
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = BaseReg;
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ | CS_AC_WRITE;
								 MI->flat_insn->detail->arm.op_count++;
							 }
							 if (Writeback) {
								 MI->writeback = true;
								 SStream_concat0(O, "!");
							 }
							 SStream_concat0(O, ", ");
							 printRegisterList(MI, 3, O);
							 return;
						 }

						 // Combine 2 GPRs from disassember into a GPRPair to match with instr def.
						 // ldrexd/strexd require even/odd GPR pair. To enforce this constraint,
						 // a single GPRPair reg operand is used in the .td file to replace the two
						 // GPRs. However, when decoding them, the two GRPs cannot be automatically
						 // expressed as a GPRPair, so we have to manually merge them.
						 // FIXME: We would really like to be able to tablegen'erate this.
		case ARM_LDREXD:
		case ARM_STREXD:
		case ARM_LDAEXD:
		case ARM_STLEXD: {
				const MCRegisterClass* MRC = MCRegisterInfo_getRegClass(MRI, ARM_GPRRegClassID);
				bool isStore = Opcode == ARM_STREXD || Opcode == ARM_STLEXD;
				unsigned Reg = MCOperand_getReg(MCInst_getOperand(MI, isStore ? 1 : 0));

				if (MCRegisterClass_contains(MRC, Reg)) {
				    MCInst NewMI;

				    MCInst_Init(&NewMI);
				    MCInst_setOpcode(&NewMI, Opcode);

				    if (isStore)
						MCInst_addOperand2(&NewMI, MCInst_getOperand(MI, 0));

				    MCOperand_CreateReg0(&NewMI, MCRegisterInfo_getMatchingSuperReg(MRI, Reg, ARM_gsub_0,
								MCRegisterInfo_getRegClass(MRI, ARM_GPRPairRegClassID)));

				    // Copy the rest operands into NewMI.
				    for(i = isStore ? 3 : 2; i < MCInst_getNumOperands(MI); ++i)
						MCInst_addOperand2(&NewMI, MCInst_getOperand(MI, i));

				    printInstruction(&NewMI, O, MRI);
				    return;
				}
				break;
		 }
		 // B9.3.3 ERET (Thumb)
		 // For a target that has Virtualization Extensions, ERET is the preferred
		 // disassembly of SUBS PC, LR, #0
		case ARM_t2SUBS_PC_LR: {
						MCOperand *opc = MCInst_getOperand(MI, 0);
						if (MCInst_getNumOperands(MI) == 3 &&
							MCOperand_isImm(opc) &&
							MCOperand_getImm(opc) == 0 &&
							(ARM_getFeatureBits(MI->csh->mode) & ARM_FeatureVirtualization)) {
							SStream_concat0(O, "eret");
							MCInst_setOpcodePub(MI, ARM_INS_ERET);
							printPredicateOperand(MI, 1, O);
							return;
						}
						break;
				}
	}

	//if (printAliasInstr(MI, O, MRI))
	//	printInstruction(MI, O, MRI);
	printInstruction(MI, O, MRI);
}